

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O3

void __thiscall ncnn::ObjectsManager::ObjectsManager(ObjectsManager *this,size_t steps)

{
  undefined1 auVar1 [16];
  SafeOrderList<ncnn::ObjectBox> *pSVar2;
  size_t sVar3;
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = steps;
  sVar3 = 1;
  if (steps < 0x65) {
    sVar3 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(100)) / auVar1,0);
  }
  (this->object_boxs_table).
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->object_boxs_table).
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->object_boxs_table).
  super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->step = sVar3;
  uVar4 = (ulong)(byte)(100 / (byte)sVar3);
  this->prob_steps = uVar4;
  std::
  vector<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
  ::resize(&this->object_boxs_table,uVar4);
  if (this->prob_steps != 0) {
    uVar4 = 0;
    do {
      pSVar2 = (SafeOrderList<ncnn::ObjectBox> *)operator_new(0x48);
      *(SafeOrderList<ncnn::ObjectBox> **)
       ((long)&(pSVar2->container).
               super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> + 8) = pSVar2;
      *(SafeOrderList<ncnn::ObjectBox> **)
       &(pSVar2->container).super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> =
           pSVar2;
      *(size_t *)
       ((long)&(pSVar2->container).
               super__List_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> + 0x10) = 0;
      pthread_mutex_init((pthread_mutex_t *)&pSVar2->mutex,(pthread_mutexattr_t *)0x0);
      pSVar2->condition = object_compare;
      (this->object_boxs_table).
      super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar4] = pSVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->prob_steps);
  }
  return;
}

Assistant:

ObjectsManager::ObjectsManager(size_t steps) : object_boxs_table()
{
    step = prob_steps_MAX / steps;
    step = step <= 0 ? 1 : step;
    prob_steps = prob_steps_MAX / step;
    object_boxs_table.resize(prob_steps);
    for (size_t i = 0; i < prob_steps; i++)
    {
        object_boxs_table[i] = new TObjectBoxs(object_compare);
    }
}